

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O2

int32 hmm_vit_eval(hmm_t *hmm)

{
  uint8 uVar1;
  hmm_context_t *phVar2;
  int *piVar3;
  int32 *piVar4;
  int *piVar5;
  s3senid_t **ppsVar6;
  short *psVar7;
  int iVar8;
  int32 iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  int *piVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  bool bVar25;
  
  uVar1 = hmm->n_emit_state;
  if (hmm->mpx == '\0') {
    if (uVar1 != '\x03') {
      if (uVar1 != '\x05') goto LAB_0010e832;
      phVar2 = hmm->ctx;
      piVar4 = phVar2->senscore;
      piVar3 = *phVar2->tp[hmm->tmatid];
      psVar7 = phVar2->sseq[(hmm->s).ssid];
      iVar8 = piVar4[psVar7[4]] + hmm->state[4].score;
      iVar11 = piVar4[psVar7[3]] + hmm->state[3].score;
      iVar15 = -0x38000000;
      if (iVar8 < -0x37ffffff) {
        iVar8 = -0x38000000;
      }
      if (-0x38000000 < iVar11) {
        iVar15 = piVar3[0x1d] + iVar8;
        iVar16 = piVar3[0x17] + iVar11;
        iVar14 = iVar16;
        if (iVar16 < iVar15) {
          iVar14 = iVar15;
        }
        (hmm->out).history = hmm->state[(ulong)(iVar16 < iVar15) + 3].history;
        iVar15 = -0x38000000;
        if (-0x38000000 < iVar14) {
          iVar15 = iVar14;
        }
        (hmm->out).score = iVar15;
      }
      iVar14 = piVar4[psVar7[2]] + hmm->state[2].score;
      if (-0x38000000 < iVar14) {
        iVar8 = iVar8 + piVar3[0x1c];
        iVar16 = piVar3[0x16] + iVar11;
        iVar19 = piVar3[0x10] + iVar14;
        if (iVar16 < iVar8) {
          if (iVar8 < iVar19) {
            lVar10 = 0x30;
            iVar8 = iVar19;
            goto LAB_0010ede7;
          }
        }
        else {
          iVar8 = iVar19;
          if (iVar19 <= iVar16) {
            iVar8 = iVar16;
          }
          lVar10 = (ulong)(iVar19 <= iVar16) * 0x10 + 0x30;
LAB_0010ede7:
          hmm->state[4].history =
               *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
        }
        iVar16 = -0x38000000;
        if (-0x38000000 < iVar8) {
          iVar16 = iVar8;
        }
        if (iVar15 < iVar8) {
          iVar15 = iVar16;
        }
        hmm->state[4].score = iVar16;
      }
      iVar8 = piVar4[psVar7[1]] + hmm->state[1].score;
      if (-0x38000000 < iVar8) {
        iVar11 = iVar11 + piVar3[0x15];
        iVar16 = piVar3[0xf] + iVar14;
        iVar19 = piVar3[9] + iVar8;
        if (iVar16 < iVar11) {
          if (iVar11 < iVar19) {
            uVar12 = 0x20;
            iVar11 = iVar19;
            goto LAB_0010ee61;
          }
        }
        else {
          iVar11 = iVar19;
          if (iVar19 <= iVar16) {
            iVar11 = iVar16;
          }
          uVar12 = (ulong)(iVar19 <= iVar16) << 4 | 0x20;
LAB_0010ee61:
          hmm->state[3].history =
               *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + (uVar12 - 8));
        }
        iVar16 = -0x38000000;
        if (-0x38000000 < iVar11) {
          iVar16 = iVar11;
        }
        if (iVar15 < iVar11) {
          iVar15 = iVar16;
        }
        hmm->state[3].score = iVar16;
      }
      iVar11 = piVar4[*psVar7] + hmm->state[0].score;
      iVar14 = iVar14 + piVar3[0xe];
      iVar19 = piVar3[8] + iVar8;
      iVar16 = piVar3[2] + iVar11;
      if (iVar19 < iVar14) {
        if (iVar14 < iVar16) {
          lVar10 = 0x10;
          iVar14 = iVar16;
          goto LAB_0010eece;
        }
      }
      else {
        iVar14 = iVar16;
        if (iVar16 <= iVar19) {
          iVar14 = iVar19;
        }
        lVar10 = (ulong)(iVar16 <= iVar19) * 0x10 + 0x10;
LAB_0010eece:
        hmm->state[2].history =
             *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
      }
      if (iVar14 < -0x37ffffff) {
        iVar14 = -0x38000000;
      }
      hmm->state[2].score = iVar14;
      iVar16 = piVar3[1];
      iVar19 = iVar8 + piVar3[7];
      if (iVar8 + piVar3[7] <= iVar16 + iVar11) {
        hmm->state[1].history = hmm->state[0].history;
        iVar19 = iVar16 + iVar11;
      }
      if (iVar15 < iVar14) {
        iVar15 = iVar14;
      }
      if (iVar19 < -0x37ffffff) {
        iVar19 = -0x38000000;
      }
      if (iVar15 < iVar19) {
        iVar15 = iVar19;
      }
      hmm->state[1].score = iVar19;
      iVar11 = iVar11 + *piVar3;
      if (iVar11 < -0x37ffffff) {
        iVar11 = -0x38000000;
      }
      if (iVar15 < iVar11) {
        iVar15 = iVar11;
      }
      hmm->state[0].score = iVar11;
      goto LAB_0010ef37;
    }
    phVar2 = hmm->ctx;
    piVar4 = phVar2->senscore;
    piVar3 = *phVar2->tp[hmm->tmatid];
    psVar7 = phVar2->sseq[(hmm->s).ssid];
    iVar14 = piVar4[psVar7[2]] + hmm->state[2].score;
    iVar11 = piVar4[psVar7[1]] + hmm->state[1].score;
    iVar15 = -0x38000000;
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar14) {
      iVar15 = piVar3[0xb] + iVar14;
      iVar8 = iVar14 + piVar3[10];
    }
    iVar14 = -0x80000000;
    if (-0x38000000 < iVar11) {
      iVar14 = -0x80000000;
      if (-0x38000000 < piVar3[7]) {
        iVar14 = piVar3[7] + iVar11;
      }
    }
    iVar19 = piVar4[*psVar7] + hmm->state[0].score;
    iVar16 = iVar14;
    if (iVar14 < iVar15) {
      iVar16 = iVar15;
    }
    if (iVar16 < -0x37ffffff) {
      iVar16 = -0x38000000;
    }
    (hmm->out).history = hmm->state[(ulong)(iVar14 < iVar15) + 1].history;
    (hmm->out).score = iVar16;
    iVar15 = -0x38000000;
    if (-0x38000000 < iVar11) {
      iVar15 = piVar3[6] + iVar11;
    }
    iVar14 = -0x38000000;
    if (-0x38000000 < piVar3[2]) {
      iVar14 = piVar3[2] + iVar19;
    }
    if (iVar15 < iVar8) {
      if (iVar8 < iVar14) {
        lVar10 = 0x10;
        iVar8 = iVar14;
        goto LAB_0010ed3c;
      }
    }
    else {
      iVar8 = iVar14;
      if (iVar14 <= iVar15) {
        iVar8 = iVar15;
      }
      lVar10 = (ulong)(iVar14 <= iVar15) * 0x10 + 0x10;
LAB_0010ed3c:
      hmm->state[2].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
    }
    iVar15 = -0x38000000;
    if (-0x38000000 < iVar8) {
      iVar15 = iVar8;
    }
    iVar22 = -0x38000000;
    hmm->state[2].score = iVar15;
    iVar14 = -0x38000000;
    if (-0x38000000 < iVar11) {
      iVar14 = iVar11 + piVar3[5];
    }
    if (-0x38000000 < iVar19) {
      iVar22 = piVar3[1] + iVar19;
    }
    if (iVar14 <= iVar22) {
      hmm->state[1].history = hmm->state[0].history;
      iVar14 = iVar22;
    }
    if (iVar8 <= iVar16) {
      iVar15 = iVar16;
    }
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar14) {
      iVar8 = iVar14;
    }
    if (iVar15 < iVar14) {
      iVar15 = iVar8;
    }
    hmm->state[1].score = iVar8;
    iVar19 = iVar19 + *piVar3;
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar19) {
      iVar8 = iVar19;
    }
    bVar25 = SBORROW4(iVar19,iVar15);
    iVar11 = iVar19 - iVar15;
    bVar24 = iVar19 == iVar15;
  }
  else {
    if (uVar1 == '\x03') {
      phVar2 = hmm->ctx;
      piVar3 = (hmm->s).mpx_ssid;
      piVar4 = phVar2->senscore;
      piVar5 = *phVar2->tp[hmm->tmatid];
      ppsVar6 = phVar2->sseq;
      iVar11 = -0x38000000;
      iVar8 = -0x38000000;
      iVar15 = -0x38000000;
      if ((long)piVar3[2] != -1) {
        iVar15 = piVar4[ppsVar6[piVar3[2]][2]] + hmm->state[2].score;
        iVar8 = -0x38000000;
        if (-0x38000000 < iVar15) {
          iVar8 = iVar15;
        }
        iVar15 = piVar5[0xb] + iVar8;
      }
      if ((long)piVar3[1] == -1) {
        iVar14 = -0x80000000;
      }
      else {
        iVar14 = piVar4[ppsVar6[piVar3[1]][1]] + hmm->state[1].score;
        iVar11 = -0x38000000;
        if (-0x38000000 < iVar14) {
          iVar11 = iVar14;
        }
        iVar14 = piVar5[7] + iVar11;
      }
      iVar16 = iVar15;
      if (iVar15 <= iVar14) {
        iVar16 = iVar14;
      }
      (hmm->out).history = hmm->state[(ulong)(iVar14 < iVar15) + 1].history;
      iVar15 = -0x38000000;
      if (iVar16 < -0x37ffffff) {
        iVar16 = -0x38000000;
      }
      (hmm->out).score = iVar16;
      iVar19 = piVar4[*ppsVar6[*piVar3]] + hmm->state[0].score;
      if (iVar19 < -0x37ffffff) {
        iVar19 = -0x38000000;
      }
      iVar22 = -0x38000000;
      if (iVar8 != -0x38000000) {
        iVar22 = iVar8 + piVar5[10];
      }
      if (iVar11 != -0x38000000) {
        iVar15 = piVar5[6] + iVar11;
      }
      if (-0x38000000 < piVar5[2]) {
        iVar14 = piVar5[2] + iVar19;
      }
      piVar18 = piVar3;
      if (iVar15 < iVar22) {
        if (iVar22 < iVar14) {
          lVar10 = 0x10;
          iVar22 = iVar14;
          goto LAB_0010ec91;
        }
      }
      else {
        bVar24 = iVar14 <= iVar15;
        if (iVar14 <= iVar15) {
          iVar14 = iVar15;
          piVar18 = piVar3 + 1;
        }
        lVar10 = (ulong)bVar24 * 0x10 + 0x10;
        iVar22 = iVar14;
LAB_0010ec91:
        hmm->state[2].history =
             *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
        piVar3[2] = *piVar18;
      }
      iVar8 = -0x38000000;
      iVar15 = -0x38000000;
      if (-0x38000000 < iVar22) {
        iVar15 = iVar22;
      }
      hmm->state[2].score = iVar15;
      if (iVar11 != -0x38000000) {
        iVar8 = iVar11 + piVar5[5];
      }
      iVar11 = piVar5[1];
      if (iVar8 <= iVar11 + iVar19) {
        hmm->state[1].history = hmm->state[0].history;
        piVar3[1] = *piVar3;
        iVar8 = iVar11 + iVar19;
      }
      if (iVar22 <= iVar16) {
        iVar15 = iVar16;
      }
      iVar11 = -0x38000000;
      if (-0x38000000 < iVar8) {
        iVar11 = iVar8;
      }
      if (iVar15 < iVar8) {
        iVar15 = iVar11;
      }
      hmm->state[1].score = iVar11;
      iVar19 = iVar19 + *piVar5;
      iVar8 = -0x38000000;
      if (-0x38000000 < iVar19) {
        iVar8 = iVar19;
      }
      if (iVar15 < iVar19) {
        iVar15 = iVar8;
      }
      hmm->state[0].score = iVar8;
      goto LAB_0010ef37;
    }
    if (uVar1 != '\x05') {
LAB_0010e832:
      iVar9 = hmm_vit_eval_anytopo(hmm);
      return iVar9;
    }
    phVar2 = hmm->ctx;
    piVar3 = (hmm->s).mpx_ssid;
    piVar4 = phVar2->senscore;
    piVar5 = *phVar2->tp[hmm->tmatid];
    ppsVar6 = phVar2->sseq;
    iVar11 = -0x38000000;
    iVar8 = -0x38000000;
    iVar15 = -0x38000000;
    if ((long)piVar3[4] != -1) {
      iVar8 = piVar4[ppsVar6[piVar3[4]][4]] + hmm->state[4].score;
      iVar15 = piVar5[0x1d] + iVar8;
    }
    iVar14 = -0x38000000;
    if ((long)piVar3[3] != -1) {
      iVar11 = piVar4[ppsVar6[piVar3[3]][3]] + hmm->state[3].score;
      iVar14 = piVar5[0x17] + iVar11;
    }
    iVar16 = iVar14;
    if (iVar14 < iVar15) {
      iVar16 = iVar15;
    }
    (hmm->out).history = hmm->state[(ulong)(iVar14 < iVar15) + 3].history;
    iVar14 = -0x38000000;
    if (iVar16 < -0x37ffffff) {
      iVar16 = -0x38000000;
    }
    (hmm->out).score = iVar16;
    iVar19 = -0x38000000;
    iVar15 = -0x38000000;
    if ((long)piVar3[2] != -1) {
      iVar19 = piVar4[ppsVar6[piVar3[2]][2]] + hmm->state[2].score;
      iVar15 = piVar5[0x10] + iVar19;
    }
    if (iVar8 != -0x38000000) {
      iVar14 = iVar8 + piVar5[0x1c];
    }
    iVar8 = -0x38000000;
    if (iVar11 != -0x38000000) {
      iVar8 = piVar5[0x16] + iVar11;
    }
    piVar18 = piVar3 + 2;
    piVar17 = piVar18;
    if (iVar8 < iVar14) {
      if (iVar14 < iVar15) {
        lVar10 = 0x30;
        goto LAB_0010e9e8;
      }
    }
    else {
      bVar24 = iVar15 <= iVar8;
      if (iVar15 <= iVar8) {
        iVar15 = iVar8;
        piVar17 = piVar3 + 3;
      }
      lVar10 = (ulong)bVar24 * 0x10 + 0x30;
LAB_0010e9e8:
      hmm->state[4].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
      piVar3[4] = *piVar17;
      iVar14 = iVar15;
    }
    iVar8 = -0x38000000;
    iVar15 = -0x38000000;
    if (-0x38000000 < iVar14) {
      iVar15 = iVar14;
    }
    hmm->state[4].score = iVar15;
    iVar13 = -0x38000000;
    iVar22 = -0x38000000;
    if ((long)piVar3[1] != -1) {
      iVar13 = piVar4[ppsVar6[piVar3[1]][1]] + hmm->state[1].score;
      iVar22 = piVar5[9] + iVar13;
    }
    if (iVar11 != -0x38000000) {
      iVar8 = iVar11 + piVar5[0x15];
    }
    iVar11 = -0x38000000;
    if (iVar19 != -0x38000000) {
      iVar11 = piVar5[0xf] + iVar19;
    }
    piVar17 = piVar3 + 1;
    piVar21 = piVar17;
    if (iVar11 < iVar8) {
      if (iVar8 < iVar22) {
        uVar12 = 0x20;
        goto LAB_0010eaa4;
      }
    }
    else {
      bVar24 = iVar22 <= iVar11;
      if (iVar22 <= iVar11) {
        iVar22 = iVar11;
        piVar21 = piVar18;
      }
      uVar12 = (ulong)bVar24 << 4 | 0x20;
LAB_0010eaa4:
      hmm->state[3].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + (uVar12 - 8));
      piVar3[3] = *piVar21;
      iVar8 = iVar22;
    }
    iVar11 = -0x38000000;
    if (-0x38000000 < iVar8) {
      iVar11 = iVar8;
    }
    iVar23 = -0x38000000;
    hmm->state[3].score = iVar11;
    iVar22 = -0x38000000;
    if (iVar19 != -0x38000000) {
      iVar22 = iVar19 + piVar5[0xe];
    }
    iVar19 = piVar4[*ppsVar6[*piVar3]] + hmm->state[0].score;
    if (iVar13 != -0x38000000) {
      iVar23 = piVar5[8] + iVar13;
    }
    iVar20 = piVar5[2] + iVar19;
    piVar18 = piVar3;
    if (iVar23 < iVar22) {
      if (iVar22 < iVar20) {
        lVar10 = 0x10;
        iVar22 = iVar20;
        goto LAB_0010eb47;
      }
    }
    else {
      iVar22 = iVar20;
      if (iVar20 <= iVar23) {
        iVar22 = iVar23;
        piVar18 = piVar17;
      }
      lVar10 = (ulong)(iVar20 <= iVar23) * 0x10 + 0x10;
LAB_0010eb47:
      hmm->state[2].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
      piVar3[2] = *piVar18;
    }
    iVar20 = -0x38000000;
    iVar23 = -0x38000000;
    if (-0x38000000 < iVar22) {
      iVar23 = iVar22;
    }
    hmm->state[2].score = iVar23;
    if (iVar13 != -0x38000000) {
      iVar20 = iVar13 + piVar5[7];
    }
    iVar13 = piVar5[1];
    if (iVar20 <= iVar13 + iVar19) {
      hmm->state[1].history = hmm->state[0].history;
      piVar3[1] = *piVar3;
      iVar20 = iVar13 + iVar19;
    }
    if (iVar14 <= iVar16) {
      iVar15 = iVar16;
    }
    if (iVar15 < iVar8) {
      iVar15 = iVar11;
    }
    if (iVar15 < iVar22) {
      iVar15 = iVar23;
    }
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar20) {
      iVar8 = iVar20;
    }
    if (iVar15 < iVar20) {
      iVar15 = iVar8;
    }
    hmm->state[1].score = iVar8;
    iVar8 = iVar19 + *piVar5;
    if (iVar19 + *piVar5 < -0x37ffffff) {
      iVar8 = -0x38000000;
    }
    bVar25 = SBORROW4(iVar8,iVar15);
    iVar11 = iVar8 - iVar15;
    bVar24 = iVar8 == iVar15;
  }
  if (!bVar24 && bVar25 == iVar11 < 0) {
    iVar15 = iVar8;
  }
  hmm->state[0].score = iVar8;
LAB_0010ef37:
  hmm->bestscore = iVar15;
  return iVar15;
}

Assistant:

int32
hmm_vit_eval(hmm_t * hmm)
{
    if (hmm_is_mpx(hmm)) {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr_mpx(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr_mpx(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
    else {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
}